

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ushort uVar5;
  ulong uVar6;
  uint16_t *puVar7;
  BrotliDictionary *pBVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint8_t *puVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  byte bVar17;
  long lVar18;
  ulong uVar19;
  uint32_t uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint8_t *puVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint16_t uVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  uint16_t *num;
  ulong local_128;
  size_t local_120;
  int local_114;
  ulong local_108;
  ulong local_100;
  ulong local_d0;
  ulong local_c8;
  ulong local_b8;
  Command_conflict *local_b0;
  int last_distance;
  
  iVar21 = params->lgwin;
  local_120 = *last_insert_len;
  uVar1 = position + num_bytes;
  uVar11 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar11 = position;
  }
  lVar18 = 0x200;
  if (params->quality < 9) {
    lVar18 = 0x40;
  }
  iVar31 = *(int *)(hasher + 0x10);
  if (4 < iVar31) {
    iVar10 = *dist_cache;
    dist_cache[4] = iVar10 + -1;
    dist_cache[5] = iVar10 + 1;
    dist_cache[6] = iVar10 + -2;
    dist_cache[7] = iVar10 + 2;
    dist_cache[8] = iVar10 + -3;
    dist_cache[9] = iVar10 + 3;
    if (10 < iVar31) {
      iVar31 = dist_cache[1];
      dist_cache[10] = iVar31 + -1;
      dist_cache[0xb] = iVar31 + 1;
      dist_cache[0xc] = iVar31 + -2;
      dist_cache[0xd] = iVar31 + 2;
      dist_cache[0xe] = iVar31 + -3;
      dist_cache[0xf] = iVar31 + 3;
    }
  }
  if (uVar1 <= position + 4) {
    local_b0 = commands;
LAB_00111b79:
    *last_insert_len = (local_120 + uVar1) - position;
    *num_commands = *num_commands + ((long)local_b0 - (long)commands >> 4);
    return;
  }
  uVar4 = (1L << ((byte)iVar21 & 0x3f)) - 0x10;
  uVar43 = lVar18 + position;
  lVar3 = position - 1;
  local_b0 = commands;
  uVar24 = position;
LAB_00110949:
  uVar34 = uVar1 - uVar24;
  uVar28 = uVar4;
  if (uVar24 < uVar4) {
    uVar28 = uVar24;
  }
  uVar6 = (params->dist).max_distance;
  uVar40 = uVar24 & ringbuffer_mask;
  if ((long)*(int *)(hasher + 0x10) == 0) {
    local_100 = 0x7e4;
    local_108 = 0;
    local_b8 = 0;
    uVar23 = 0;
  }
  else {
    puVar26 = ringbuffer + uVar40;
    uVar29 = (ulong)((uint)uVar34 & 7);
    local_100 = 0x7e4;
    uVar23 = 0;
    uVar27 = 0;
    local_b8 = 0;
    local_108 = 0;
    do {
      uVar22 = (ulong)dist_cache[uVar27];
      if (((uVar22 <= uVar28) && (uVar24 - uVar22 < uVar24)) && (uVar23 + uVar40 <= ringbuffer_mask)
         ) {
        uVar19 = uVar24 - uVar22 & ringbuffer_mask;
        if ((uVar19 + uVar23 <= ringbuffer_mask) &&
           (ringbuffer[uVar23 + uVar40] == ringbuffer[uVar19 + uVar23])) {
          if (7 < uVar34) {
            lVar12 = 0;
            uVar35 = 0;
LAB_00110a2c:
            if (*(ulong *)(puVar26 + uVar35 * 8) == *(ulong *)(ringbuffer + uVar35 * 8 + uVar19))
            goto code_r0x00110a39;
            uVar35 = *(ulong *)(ringbuffer + uVar35 * 8 + uVar19) ^ *(ulong *)(puVar26 + uVar35 * 8)
            ;
            uVar19 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
            uVar35 = (uVar19 >> 3 & 0x1fffffff) - lVar12;
            goto LAB_00110a87;
          }
          puVar13 = puVar26;
          uVar25 = 0;
LAB_00110afa:
          uVar35 = uVar25;
          if (uVar29 != 0) {
            uVar36 = uVar29 | uVar25;
            uVar38 = uVar29;
            do {
              uVar35 = uVar25;
              if (ringbuffer[uVar25 + uVar19] != *puVar13) break;
              puVar13 = puVar13 + 1;
              uVar25 = uVar25 + 1;
              uVar38 = uVar38 - 1;
              uVar35 = uVar36;
            } while (uVar38 != 0);
          }
LAB_00110a87:
          if (((2 < uVar35) || ((uVar27 < 2 && (uVar35 == 2)))) &&
             (uVar19 = uVar35 * 0x87 + 0x78f, local_100 < uVar19)) {
            if (uVar27 != 0) {
              uVar19 = uVar19 - ((0x1ca10U >> ((byte)uVar27 & 0xe) & 0xe) + 0x27);
            }
            if (local_100 < uVar19) {
              uVar23 = uVar35;
              local_108 = uVar22;
              local_100 = uVar19;
              local_b8 = uVar35;
            }
          }
        }
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != (long)*(int *)(hasher + 0x10));
  }
  uVar39 = (uint)(*(int *)(ringbuffer + uVar40) * 0x1e35a7bd) >> (hasher[0x38] & 0x1f);
  lVar12 = *(long *)(hasher + 0x28) * 2 + 0x40;
  piVar2 = (int *)(ringbuffer + uVar40);
  lVar41 = (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 + lVar12;
  uVar5 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
  uVar22 = (ulong)uVar5;
  uVar27 = *(ulong *)(hasher + 0x30);
  uVar29 = 0;
  if (uVar27 <= uVar22) {
    uVar29 = uVar22 - uVar27;
  }
  uVar19 = (ulong)((uint)uVar34 & 7);
  do {
    if (uVar22 <= uVar29) break;
    uVar22 = uVar22 - 1;
    uVar35 = uVar24 - *(uint *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar22) * 4 +
                                         lVar41);
    if ((uVar35 <= uVar28) && (uVar23 + uVar40 <= ringbuffer_mask)) {
      uVar25 = (ulong)(*(uint *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar22) * 4 +
                                          lVar41) & (uint)ringbuffer_mask);
      if ((uVar25 + uVar23 <= ringbuffer_mask) &&
         (ringbuffer[uVar23 + uVar40] == ringbuffer[uVar25 + uVar23])) {
        if (7 < uVar34) {
          lVar14 = 0;
          uVar38 = 0;
LAB_00110c51:
          if (*(ulong *)(piVar2 + uVar38 * 2) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar25))
          goto code_r0x00110c63;
          uVar38 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar25) ^ *(ulong *)(piVar2 + uVar38 * 2);
          uVar25 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar38 = (uVar25 >> 3 & 0x1fffffff) - lVar14;
          goto LAB_00110c9f;
        }
        piVar15 = piVar2;
        uVar36 = 0;
LAB_00110ce8:
        uVar38 = uVar36;
        if (uVar19 != 0) {
          uVar37 = uVar19 | uVar36;
          uVar42 = uVar19;
          do {
            uVar38 = uVar36;
            if (ringbuffer[uVar36 + uVar25] != (uint8_t)*piVar15) break;
            piVar15 = (int *)((long)piVar15 + 1);
            uVar36 = uVar36 + 1;
            uVar42 = uVar42 - 1;
            uVar38 = uVar37;
          } while (uVar42 != 0);
        }
LAB_00110c9f:
        if (3 < uVar38) {
          iVar21 = 0x1f;
          if ((uint)uVar35 != 0) {
            for (; (uint)uVar35 >> iVar21 == 0; iVar21 = iVar21 + -1) {
            }
          }
          uVar25 = (ulong)(iVar21 * -0x1e + 0x780) + uVar38 * 0x87;
          if (local_100 < uVar25) {
            uVar23 = uVar38;
            local_108 = uVar35;
            local_100 = uVar25;
            local_b8 = uVar38;
          }
        }
      }
    }
  } while (uVar35 <= uVar28);
  *(int *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar41) = (int)uVar24;
  *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar5 + 1;
  local_114 = 0;
  if ((local_100 == 0x7e4) && (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
    uVar40 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
    puVar7 = (params->dictionary).hash_table;
    lVar41 = *(long *)(hasher + 0x18);
    local_114 = 0;
    lVar14 = 0;
LAB_00111533:
    uVar5 = puVar7[uVar40];
    lVar41 = lVar41 + 1;
    *(long *)(hasher + 0x18) = lVar41;
    if ((ulong)uVar5 != 0) {
      uVar39 = uVar5 & 0x1f;
      uVar23 = (ulong)uVar39;
      bVar44 = true;
      if (uVar23 <= uVar34) {
        pBVar8 = (params->dictionary).words;
        puVar26 = pBVar8->data + (ulong)pBVar8->offsets_by_length[uVar23] + uVar23 * (uVar5 >> 5);
        if (7 < uVar23) {
          uVar22 = (ulong)(uVar5 & 0x18);
          lVar16 = 0;
          uVar29 = 0;
LAB_001115c7:
          if (*(ulong *)(puVar26 + uVar29 * 8) == *(ulong *)(piVar2 + uVar29 * 2))
          goto code_r0x001115d9;
          uVar22 = *(ulong *)(piVar2 + uVar29 * 2) ^ *(ulong *)(puVar26 + uVar29 * 8);
          uVar29 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
            }
          }
          uVar29 = (uVar29 >> 3 & 0x1fffffff) - lVar16;
          goto LAB_00111633;
        }
        uVar22 = 0;
        goto LAB_001116d1;
      }
      goto LAB_00111554;
    }
    goto LAB_00111567;
  }
LAB_00110d82:
  if (0x7e4 < local_100) {
    uVar28 = (lVar3 + num_bytes) - uVar24;
    iVar21 = 0;
LAB_00110da6:
    uVar34 = uVar34 - 1;
    uVar43 = local_b8 - 1;
    if (uVar34 <= local_b8 - 1) {
      uVar43 = uVar34;
    }
    if (4 < params->quality) {
      uVar43 = 0;
    }
    uVar40 = uVar24 + 1;
    uVar23 = uVar4;
    if (uVar40 < uVar4) {
      uVar23 = uVar40;
    }
    uVar29 = uVar40 & ringbuffer_mask;
    if ((long)*(int *)(hasher + 0x10) != 0) {
      puVar26 = ringbuffer + uVar29;
      uVar22 = (ulong)((uint)uVar34 & 7);
      local_128 = 0x7e4;
      uVar19 = 0;
      local_d0 = 0;
      local_c8 = 0;
LAB_00110e2a:
      uVar35 = (ulong)dist_cache[uVar19];
      if (((uVar35 <= uVar23) && (uVar40 - uVar35 < uVar40)) && (uVar43 + uVar29 <= ringbuffer_mask)
         ) {
        uVar25 = uVar40 - uVar35 & ringbuffer_mask;
        if ((ringbuffer_mask < uVar25 + uVar43) ||
           (ringbuffer[uVar43 + uVar29] != ringbuffer[uVar25 + uVar43])) goto LAB_00110ec5;
        uVar38 = uVar22;
        if (7 < uVar34) {
          lVar41 = 0;
          uVar36 = 0;
LAB_00110e87:
          if (*(ulong *)(puVar26 + uVar36 * 8) == *(ulong *)(ringbuffer + uVar36 * 8 + uVar25))
          goto code_r0x00110e94;
          uVar38 = *(ulong *)(ringbuffer + uVar36 * 8 + uVar25) ^ *(ulong *)(puVar26 + uVar36 * 8);
          uVar25 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar36 = (uVar25 >> 3 & 0x1fffffff) - lVar41;
          goto LAB_00110ee9;
        }
        uVar36 = 0;
        puVar13 = puVar26;
        goto joined_r0x00110f62;
      }
      goto LAB_00110ec5;
    }
    local_128 = 0x7e4;
    local_c8 = 0;
    local_d0 = 0;
LAB_00110faa:
    bVar17 = hasher[0x38];
    uVar39 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> (bVar17 & 0x1f);
    piVar2 = (int *)(ringbuffer + uVar29);
    uVar5 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
    uVar19 = (ulong)uVar5;
    uVar22 = 0;
    if (uVar27 <= uVar19) {
      uVar22 = uVar19 - uVar27;
    }
    lVar41 = (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 + lVar12;
    uVar35 = (ulong)((uint)uVar34 & 7);
LAB_00111005:
    if (uVar22 < uVar19) {
      uVar19 = uVar19 - 1;
      uVar25 = uVar40 - *(uint *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar19) * 4 +
                                           lVar41);
      if ((uVar25 <= uVar23) && (uVar43 + uVar29 <= ringbuffer_mask)) {
        uVar38 = (ulong)(*(uint *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar19) * 4 +
                                            lVar41) & (uint)ringbuffer_mask);
        if ((ringbuffer_mask < uVar38 + uVar43) ||
           (ringbuffer[uVar43 + uVar29] != ringbuffer[uVar38 + uVar43])) goto LAB_001110f9;
        uVar36 = uVar35;
        if (7 < uVar34) {
          lVar14 = 0;
          uVar42 = 0;
LAB_00111071:
          if (*(ulong *)(piVar2 + uVar42 * 2) == *(ulong *)(ringbuffer + uVar42 * 8 + uVar38))
          goto code_r0x00111083;
          uVar36 = *(ulong *)(ringbuffer + uVar42 * 8 + uVar38) ^ *(ulong *)(piVar2 + uVar42 * 2);
          uVar38 = 0;
          if (uVar36 != 0) {
            for (; (uVar36 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar42 = (uVar38 >> 3 & 0x1fffffff) - lVar14;
          goto LAB_001110b8;
        }
        uVar42 = 0;
        piVar15 = piVar2;
        goto joined_r0x00111113;
      }
      goto LAB_001110f9;
    }
    goto LAB_0011112b;
  }
  local_120 = local_120 + 1;
  position = uVar24 + 1;
  if (uVar43 < position) {
    if ((uint)((int)lVar18 * 4) + uVar43 < position) {
      uVar28 = uVar24 + 0x11;
      if (uVar1 - 4 <= uVar24 + 0x11) {
        uVar28 = uVar1 - 4;
      }
      for (; position < uVar28; position = position + 4) {
        uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                 (hasher[0x38] & 0x1f);
        uVar5 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
        *(int *)(hasher + (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 +
                          (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar12) =
             (int)position;
        *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar5 + 1;
        local_120 = local_120 + 4;
      }
    }
    else {
      uVar28 = uVar24 + 9;
      if (uVar1 - 3 <= uVar24 + 9) {
        uVar28 = uVar1 - 3;
      }
      for (; position < uVar28; position = position + 2) {
        uVar39 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                 (hasher[0x38] & 0x1f);
        uVar5 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
        *(int *)(hasher + (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 +
                          (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar12) =
             (int)position;
        *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar5 + 1;
        local_120 = local_120 + 2;
      }
    }
  }
  goto LAB_00111b23;
code_r0x00110a39:
  uVar35 = uVar35 + 1;
  lVar12 = lVar12 + -8;
  puVar13 = puVar26 + (uVar34 & 0xfffffffffffffff8);
  uVar25 = uVar34 & 0xfffffffffffffff8;
  if (uVar34 >> 3 == uVar35) goto LAB_00110afa;
  goto LAB_00110a2c;
code_r0x00110c63:
  uVar38 = uVar38 + 1;
  lVar14 = lVar14 + -8;
  piVar15 = (int *)((long)piVar2 + (uVar34 & 0xfffffffffffffff8));
  uVar36 = uVar34 & 0xfffffffffffffff8;
  if (uVar34 >> 3 == uVar38) goto LAB_00110ce8;
  goto LAB_00110c51;
code_r0x001115d9:
  uVar29 = uVar29 + 1;
  lVar16 = lVar16 + -8;
  if (uVar39 >> 3 == uVar29) goto code_r0x001115e5;
  goto LAB_001115c7;
code_r0x001115e5:
  puVar26 = puVar26 + -lVar16;
LAB_001116d1:
  uVar19 = (ulong)uVar5 & 7;
  uVar29 = uVar22;
  if ((uVar5 & 7) != 0) {
    uVar35 = uVar22 | uVar19;
    do {
      uVar29 = uVar22;
      if (*(uint8_t *)((long)piVar2 + uVar22) != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar22 = uVar22 + 1;
      uVar19 = uVar19 - 1;
      uVar29 = uVar35;
    } while (uVar19 != 0);
  }
LAB_00111633:
  bVar44 = true;
  if ((uVar29 != 0) && (bVar44 = true, uVar23 < (params->dictionary).cutoffTransformsCount + uVar29)
     ) {
    uVar23 = (ulong)(uVar5 >> 5) + uVar28 + 1 +
             ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                            ((char)(uVar23 - uVar29) * '\x06' & 0x3fU)) & 0x3f) +
              (uVar23 - uVar29) * 4 << (pBVar8->size_bits_by_length[uVar23] & 0x3f));
    if (uVar6 < uVar23) {
      bVar44 = true;
    }
    else {
      iVar21 = 0x1f;
      if ((uint)uVar23 != 0) {
        for (; (uint)uVar23 >> iVar21 == 0; iVar21 = iVar21 + -1) {
        }
      }
      uVar22 = (uVar29 * 0x87 - (ulong)(uint)(iVar21 * 0x1e)) + 0x780;
      bVar44 = true;
      if (local_100 <= uVar22) {
        local_114 = uVar39 - (int)uVar29;
        bVar44 = false;
        local_108 = uVar23;
        local_100 = uVar22;
        local_b8 = uVar29;
      }
    }
  }
LAB_00111554:
  if (!bVar44) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_00111567:
  uVar40 = uVar40 + 1;
  bVar44 = lVar14 != 0;
  lVar14 = lVar14 + 1;
  if (bVar44) goto LAB_00110d82;
  goto LAB_00111533;
code_r0x00110e94:
  uVar36 = uVar36 + 1;
  lVar41 = lVar41 + -8;
  if (uVar28 >> 3 == uVar36) goto code_r0x00110ea2;
  goto LAB_00110e87;
code_r0x00110ea2:
  uVar36 = -lVar41;
  puVar13 = puVar26 + -lVar41;
joined_r0x00110f62:
  for (; (uVar38 != 0 && (ringbuffer[uVar36 + uVar25] == *puVar13)); uVar36 = uVar36 + 1) {
    puVar13 = puVar13 + 1;
    uVar38 = uVar38 - 1;
  }
LAB_00110ee9:
  if (((2 < uVar36) || ((uVar19 < 2 && (uVar36 == 2)))) &&
     (uVar25 = uVar36 * 0x87 + 0x78f, local_128 < uVar25)) {
    if (uVar19 != 0) {
      uVar25 = uVar25 - ((0x1ca10U >> ((byte)uVar19 & 0xe) & 0xe) + 0x27);
    }
    if (local_128 < uVar25) {
      uVar43 = uVar36;
      local_128 = uVar25;
      local_d0 = uVar36;
      local_c8 = uVar35;
    }
  }
LAB_00110ec5:
  uVar19 = uVar19 + 1;
  if (uVar19 == (long)*(int *)(hasher + 0x10)) goto LAB_00110faa;
  goto LAB_00110e2a;
code_r0x00111083:
  uVar42 = uVar42 + 1;
  lVar14 = lVar14 + -8;
  if (uVar28 >> 3 == uVar42) goto code_r0x00111091;
  goto LAB_00111071;
code_r0x00111091:
  uVar42 = -lVar14;
  piVar15 = (int *)((long)piVar2 - lVar14);
joined_r0x00111113:
  for (; (uVar36 != 0 && (ringbuffer[uVar42 + uVar38] == (uint8_t)*piVar15)); uVar42 = uVar42 + 1) {
    uVar36 = uVar36 - 1;
    piVar15 = (int *)((long)piVar15 + 1);
  }
LAB_001110b8:
  if (3 < uVar42) {
    iVar31 = 0x1f;
    if ((uint)uVar25 != 0) {
      for (; (uint)uVar25 >> iVar31 == 0; iVar31 = iVar31 + -1) {
      }
    }
    uVar38 = (ulong)(iVar31 * -0x1e + 0x780) + uVar42 * 0x87;
    if (local_128 < uVar38) {
      uVar43 = uVar42;
      local_128 = uVar38;
      local_d0 = uVar42;
      local_c8 = uVar25;
    }
  }
LAB_001110f9:
  if (uVar23 < uVar25) goto LAB_0011112b;
  goto LAB_00111005;
LAB_0011112b:
  *(int *)(hasher + (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar41) = (int)uVar40;
  *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar5 + 1;
  if (local_128 == 0x7e4) {
    if (*(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20)) {
      uVar29 = (ulong)((uint)(*piVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar7 = (params->dictionary).hash_table;
      lVar41 = *(long *)(hasher + 0x18);
      iVar31 = 0;
      uVar43 = (ulong)(0 >> (bVar17 & 0x1f));
LAB_00111215:
      uVar5 = puVar7[uVar29];
      lVar41 = lVar41 + 1;
      *(long *)(hasher + 0x18) = lVar41;
      if ((ulong)uVar5 != 0) {
        uVar39 = uVar5 & 0x1f;
        uVar22 = (ulong)uVar39;
        bVar44 = true;
        if (uVar22 <= uVar34) {
          pBVar8 = (params->dictionary).words;
          puVar26 = pBVar8->data + (ulong)pBVar8->offsets_by_length[uVar22] + uVar22 * (uVar5 >> 5);
          if (7 < uVar22) {
            uVar19 = (ulong)(uVar5 & 0x18);
            lVar14 = 0;
            uVar35 = 0;
LAB_00111293:
            if (*(ulong *)(puVar26 + uVar35 * 8) == *(ulong *)(piVar2 + uVar35 * 2))
            goto code_r0x001112a5;
            uVar35 = *(ulong *)(piVar2 + uVar35 * 2) ^ *(ulong *)(puVar26 + uVar35 * 8);
            uVar19 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
              }
            }
            uVar35 = (uVar19 >> 3 & 0x1fffffff) - lVar14;
            goto LAB_001112f0;
          }
          uVar19 = 0;
          goto LAB_00111395;
        }
        goto LAB_00111233;
      }
      goto LAB_0011123c;
    }
    iVar31 = 0;
  }
  else {
    iVar31 = 0;
  }
LAB_00111186:
  bVar44 = local_100 + 0xaf <= local_128;
  uVar43 = uVar24;
  iVar10 = iVar21;
  if (bVar44) {
    local_120 = local_120 + 1;
    local_100 = local_128;
    local_108 = local_c8;
    uVar43 = uVar40;
    local_b8 = local_d0;
    local_114 = iVar31;
    iVar10 = iVar21 + 1;
  }
  bVar9 = 2 < iVar21;
  uVar40 = uVar24 + 5;
  uVar28 = uVar28 - 1;
  uVar24 = uVar43;
  iVar21 = iVar10;
  if (!bVar44 || (bVar9 || uVar1 <= uVar40)) goto code_r0x00111409;
  goto LAB_00110da6;
code_r0x001112a5:
  uVar35 = uVar35 + 1;
  lVar14 = lVar14 + -8;
  if (uVar39 >> 3 == uVar35) goto code_r0x001112b1;
  goto LAB_00111293;
code_r0x001112b1:
  puVar26 = puVar26 + -lVar14;
LAB_00111395:
  uVar25 = (ulong)uVar5 & 7;
  uVar35 = uVar19;
  if ((uVar5 & 7) != 0) {
    uVar38 = uVar19 | uVar25;
    do {
      uVar35 = uVar19;
      if (*(uint8_t *)((long)piVar2 + uVar19) != *puVar26) break;
      puVar26 = puVar26 + 1;
      uVar19 = uVar19 + 1;
      uVar25 = uVar25 - 1;
      uVar35 = uVar38;
    } while (uVar25 != 0);
  }
LAB_001112f0:
  bVar44 = true;
  if (((uVar35 != 0) && (uVar22 < (params->dictionary).cutoffTransformsCount + uVar35)) &&
     (uVar22 = (ulong)(uVar5 >> 5) + uVar23 + 1 +
               ((ulong)((uint)((params->dictionary).cutoffTransforms >>
                              ((char)(uVar22 - uVar35) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar22 - uVar35) * 4 << (pBVar8->size_bits_by_length[uVar22] & 0x3f)),
     uVar22 <= uVar6)) {
    iVar10 = 0x1f;
    if ((uint)uVar22 != 0) {
      for (; (uint)uVar22 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    uVar19 = (uVar35 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
    if (local_128 <= uVar19) {
      iVar31 = uVar39 - (int)uVar35;
      bVar44 = false;
      local_128 = uVar19;
      local_d0 = uVar35;
      local_c8 = uVar22;
    }
  }
LAB_00111233:
  if (!bVar44) {
    *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
  }
LAB_0011123c:
  uVar29 = uVar29 + 1;
  bVar44 = uVar43 != 0;
  uVar43 = uVar43 + 1;
  if (bVar44) goto LAB_00111186;
  goto LAB_00111215;
code_r0x00111409:
  uVar24 = uVar4;
  if (uVar43 < uVar4) {
    uVar24 = uVar43;
  }
  if (local_108 <= uVar24) {
    uVar39 = 0;
    bVar44 = false;
    if (local_108 != (long)*dist_cache) {
      if (local_108 == (long)dist_cache[1]) {
        uVar39 = 1;
      }
      else {
        uVar28 = (local_108 + 3) - (long)*dist_cache;
        if (uVar28 < 7) {
          bVar17 = (byte)((int)uVar28 << 2);
          uVar39 = 0x9750468;
        }
        else {
          uVar28 = (local_108 + 3) - (long)dist_cache[1];
          if (6 < uVar28) {
            if (local_108 != (long)dist_cache[2]) {
              bVar44 = local_108 != (long)dist_cache[3];
              uVar39 = 3;
              goto LAB_001117b9;
            }
            uVar39 = 2;
            goto LAB_001117b7;
          }
          bVar17 = (byte)((int)uVar28 << 2);
          uVar39 = 0xfdb1ace;
        }
        uVar39 = uVar39 >> (bVar17 & 0x1f) & 0xf;
      }
LAB_001117b7:
      bVar44 = false;
    }
LAB_001117b9:
    if (!bVar44) {
      uVar28 = (ulong)uVar39;
      goto LAB_001117ca;
    }
  }
  uVar28 = local_108 + 0xf;
LAB_001117ca:
  if ((local_108 <= uVar24) && (uVar28 != 0)) {
    *(undefined8 *)(dist_cache + 2) = *(undefined8 *)(dist_cache + 1);
    iVar21 = *dist_cache;
    dist_cache[1] = iVar21;
    iVar10 = (int)local_108;
    *dist_cache = iVar10;
    iVar31 = *(int *)(hasher + 0x10);
    if (4 < iVar31) {
      dist_cache[4] = iVar10 + -1;
      dist_cache[5] = iVar10 + 1;
      dist_cache[6] = iVar10 + -2;
      dist_cache[7] = iVar10 + 2;
      dist_cache[8] = iVar10 + -3;
      dist_cache[9] = iVar10 + 3;
      if (10 < iVar31) {
        dist_cache[10] = iVar21 + -1;
        dist_cache[0xb] = iVar21 + 1;
        dist_cache[0xc] = iVar21 + -2;
        dist_cache[0xd] = iVar21 + 2;
        dist_cache[0xe] = iVar21 + -3;
        dist_cache[0xf] = iVar21 + 3;
      }
    }
  }
  uVar39 = (uint)local_120;
  local_b0->insert_len_ = uVar39;
  local_b0->copy_len_ = local_114 << 0x19 | (uint)local_b8;
  uVar34 = (ulong)(params->dist).num_direct_distance_codes;
  uVar24 = uVar34 + 0x10;
  if (uVar28 < uVar24) {
    local_b0->dist_prefix_ = (uint16_t)uVar28;
    uVar20 = 0;
  }
  else {
    uVar20 = (params->dist).distance_postfix_bits;
    bVar17 = (byte)uVar20;
    uVar28 = ((4L << (bVar17 & 0x3f)) + (uVar28 - uVar34)) - 0x10;
    uVar32 = 0x1f;
    if ((uint)uVar28 != 0) {
      for (; (uint)uVar28 >> uVar32 == 0; uVar32 = uVar32 - 1) {
      }
    }
    uVar32 = (uVar32 ^ 0xffffffe0) + 0x1f;
    bVar44 = (uVar28 >> ((ulong)uVar32 & 0x3f) & 1) != 0;
    iVar21 = uVar32 - uVar20;
    local_b0->dist_prefix_ =
         (short)((uint)bVar44 + iVar21 * 2 + 0xfffe << (bVar17 & 0x3f)) +
         (short)uVar24 + (~(ushort)(-1 << (bVar17 & 0x1f)) & (ushort)uVar28) | (short)iVar21 * 0x400
    ;
    uVar20 = (uint32_t)(uVar28 - ((ulong)bVar44 + 2 << ((byte)uVar32 & 0x3f)) >> (bVar17 & 0x3f));
  }
  local_b0->dist_extra_ = uVar20;
  if (5 < local_120) {
    if (local_120 < 0x82) {
      uVar39 = 0x1f;
      uVar32 = (uint)(local_120 - 2);
      if (uVar32 != 0) {
        for (; uVar32 >> uVar39 == 0; uVar39 = uVar39 - 1) {
        }
      }
      uVar39 = (int)(local_120 - 2 >> ((char)(uVar39 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar39 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_120 < 0x842) {
      uVar32 = 0x1f;
      if (uVar39 - 0x42 != 0) {
        for (; uVar39 - 0x42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar39 = (uVar32 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar39 = 0x15;
      if (0x1841 < local_120) {
        uVar39 = (uint)(ushort)(0x17 - (local_120 < 0x5842));
      }
    }
  }
  uVar32 = local_114 + (uint)local_b8;
  if (uVar32 < 10) {
    uVar33 = uVar32 - 2;
  }
  else if (uVar32 < 0x86) {
    uVar32 = uVar32 - 6;
    uVar33 = 0x1f;
    if (uVar32 != 0) {
      for (; uVar32 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (int)((ulong)(long)(int)uVar32 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar33 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar33 = 0x17;
    if (uVar32 < 0x846) {
      uVar33 = 0x1f;
      if (uVar32 - 0x46 != 0) {
        for (; uVar32 - 0x46 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (uVar33 ^ 0xffe0) + 0x2c;
    }
  }
  uVar5 = (ushort)uVar33;
  uVar30 = (uVar5 & 7) + ((ushort)uVar39 & 7) * 8;
  if ((((local_b0->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar39 < 8)) && (uVar5 < 0x10)) {
    if (7 < uVar5) {
      uVar30 = uVar30 + 0x40;
    }
  }
  else {
    iVar21 = ((uVar39 & 0xffff) >> 3) * 3 + ((uVar33 & 0xffff) >> 3);
    uVar30 = uVar30 + ((ushort)(0x520d40 >> ((char)iVar21 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar21 * 0x40 + 0x40;
  }
  local_b0->cmd_prefix_ = uVar30;
  *num_literals = *num_literals + local_120;
  position = local_b8 + uVar43;
  uVar24 = uVar11;
  if (position < uVar11) {
    uVar24 = position;
  }
  uVar28 = uVar43 + 2;
  if (local_108 < local_b8 >> 2) {
    uVar34 = position + local_108 * -4;
    if (uVar34 < uVar28) {
      uVar34 = uVar28;
    }
    uVar28 = uVar34;
    if (uVar24 < uVar34) {
      uVar28 = uVar24;
    }
  }
  uVar43 = lVar18 + local_b8 * 2 + uVar43;
  local_b0 = local_b0 + 1;
  if (uVar28 < uVar24) {
    lVar12 = *(long *)(hasher + 0x28);
    do {
      uVar39 = (uint)(*(int *)(ringbuffer + (uVar28 & ringbuffer_mask)) * 0x1e35a7bd) >>
               (hasher[0x38] & 0x1f);
      uVar5 = *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40);
      *(int *)(hasher + (ulong)(uVar39 << (hasher[8] & 0x1f)) * 4 +
                        (ulong)(*(uint *)(hasher + 0x3c) & (uint)uVar5) * 4 + lVar12 * 2 + 0x40) =
           (int)uVar28;
      *(ushort *)(hasher + (ulong)uVar39 * 2 + 0x40) = uVar5 + 1;
      uVar28 = uVar28 + 1;
    } while (uVar24 != uVar28);
    local_120 = 0;
  }
  else {
    local_120 = 0;
  }
LAB_00111b23:
  uVar24 = position;
  if (uVar1 <= position + 4) goto LAB_00111b79;
  goto LAB_00110949;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}